

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_trinary_func_op_bitextract
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op,BaseType expected_result_type,BaseType input_type0,
          BaseType input_type1,BaseType input_type2)

{
  BaseType BVar1;
  bool bVar2;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  undefined4 in_register_0000008c;
  char (*pacVar5) [2];
  string expr;
  string local_240;
  string cast_op2;
  string cast_op1;
  string cast_op0;
  string op2_expr;
  string op1_expr;
  SPIRType expected_type;
  
  BVar1 = input_type0;
  pacVar5 = (char (*) [2])CONCAT44(in_register_0000008c,op2);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  SPIRType::SPIRType(&expected_type,pSVar3);
  expected_type.super_IVariant._12_4_ = BVar1;
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op0);
  if (*(BaseType *)&(pSVar4->super_IVariant).field_0xc == BVar1) {
    to_unpacked_expression_abi_cxx11_(&cast_op0,this,op0,true);
  }
  else {
    bitcast_glsl_abi_cxx11_(&cast_op0,this,&expected_type,op0);
  }
  to_unpacked_expression_abi_cxx11_(&op1_expr,this,op1,true);
  to_unpacked_expression_abi_cxx11_(&op2_expr,this,op2,true);
  BVar1 = input_type1;
  expected_type.super_IVariant._12_4_ = input_type1;
  expected_type.vecsize = 1;
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op1);
  if (*(BaseType *)&(pSVar4->super_IVariant).field_0xc == BVar1) {
    ::std::__cxx11::string::string((string *)&cast_op1,(string *)&op1_expr);
  }
  else {
    type_to_glsl_constructor_abi_cxx11_(&cast_op2,this,&expected_type);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&cast_op1,(spirv_cross *)&cast_op2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5f90,
               (char (*) [2])&op1_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,pacVar5
              );
    ::std::__cxx11::string::~string((string *)&cast_op2);
  }
  BVar1 = input_type2;
  expected_type.super_IVariant._12_4_ = input_type2;
  expected_type.vecsize = 1;
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op2);
  if (*(BaseType *)&(pSVar4->super_IVariant).field_0xc == BVar1) {
    pacVar5 = (char (*) [2])0x2681b0;
    ::std::__cxx11::string::string((string *)&cast_op2,(string *)&op2_expr);
  }
  else {
    type_to_glsl_constructor_abi_cxx11_(&expr,this,&expected_type);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&cast_op2,(spirv_cross *)&expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5f90,
               (char (*) [2])&op2_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,pacVar5
              );
    pacVar5 = (char (*) [2])0x2681f6;
    ::std::__cxx11::string::~string((string *)&expr);
  }
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  if (*(BaseType *)&(pSVar3->super_IVariant).field_0xc == expected_result_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_240,(spirv_cross *)&op,(char **)0x3b5f90,(char (*) [2])&cast_op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b2a97,
               (char (*) [3])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b2a97,
               (char (*) [3])&cast_op2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,pacVar5
              );
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_240);
  }
  else {
    expected_type.vecsize = pSVar3->vecsize;
    expected_type.super_IVariant._12_4_ = expected_result_type;
    (*(this->super_Compiler)._vptr_Compiler[0x3a])(&local_240,this,pSVar3);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_240);
    ::std::__cxx11::string::~string((string *)&local_240);
    pacVar5 = (char (*) [2])0x2682cd;
    ::std::__cxx11::string::push_back((char)&expr);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_240,(spirv_cross *)&op,(char **)0x3b5f90,(char (*) [2])&cast_op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b2a97,
               (char (*) [3])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b2a97,
               (char (*) [3])&cast_op2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,pacVar5
              );
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_240);
    ::std::__cxx11::string::push_back((char)&expr);
  }
  bVar2 = should_forward(this,op0);
  if (bVar2) {
    bVar2 = should_forward(this,op1);
    if (bVar2) {
      bVar2 = should_forward(this,op2);
      goto LAB_0026836d;
    }
  }
  bVar2 = false;
LAB_0026836d:
  emit_op(this,result_type,result_id,&expr,bVar2,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  ::std::__cxx11::string::~string((string *)&expr);
  ::std::__cxx11::string::~string((string *)&cast_op2);
  ::std::__cxx11::string::~string((string *)&cast_op1);
  ::std::__cxx11::string::~string((string *)&op2_expr);
  ::std::__cxx11::string::~string((string *)&op1_expr);
  ::std::__cxx11::string::~string((string *)&cast_op0);
  SPIRType::~SPIRType(&expected_type);
  return;
}

Assistant:

void CompilerGLSL::emit_trinary_func_op_bitextract(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                                   uint32_t op2, const char *op,
                                                   SPIRType::BaseType expected_result_type,
                                                   SPIRType::BaseType input_type0, SPIRType::BaseType input_type1,
                                                   SPIRType::BaseType input_type2)
{
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type0;

	string cast_op0 =
	    expression_type(op0).basetype != input_type0 ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);

	auto op1_expr = to_unpacked_expression(op1);
	auto op2_expr = to_unpacked_expression(op2);

	// Use value casts here instead. Input must be exactly int or uint, but SPIR-V might be 16-bit.
	expected_type.basetype = input_type1;
	expected_type.vecsize = 1;
	string cast_op1 = expression_type(op1).basetype != input_type1 ?
	                      join(type_to_glsl_constructor(expected_type), "(", op1_expr, ")") :
	                      op1_expr;

	expected_type.basetype = input_type2;
	expected_type.vecsize = 1;
	string cast_op2 = expression_type(op2).basetype != input_type2 ?
	                      join(type_to_glsl_constructor(expected_type), "(", op2_expr, ")") :
	                      op2_expr;

	string expr;
	if (out_type.basetype != expected_result_type)
	{
		expected_type.vecsize = out_type.vecsize;
		expected_type.basetype = expected_result_type;
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1) && should_forward(op2));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
}